

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TweakableParser.cpp
# Opt level: O1

Pair<Corrade::Utility::TweakableState,_long>
Corrade::Utility::TweakableParser<long>::parse(StringView value)

{
  StringView value_00;
  StringView value_01;
  StringView value_02;
  long lVar1;
  char *pcVar2;
  Debug *pDVar3;
  undefined8 uVar4;
  undefined8 extraout_RAX;
  ulong in_RSI;
  char *in_RDI;
  Pair<const_char_*,_int> PVar5;
  BasicStringView<const_char> value_03;
  Pair<Corrade::Utility::TweakableState,_long> PVar6;
  char *end;
  char *in_stack_ffffffffffffffa8;
  Warning local_40;
  char *local_18;
  
  value_00._sizePlusFlags = (size_t)in_RDI;
  value_00._data = in_stack_ffffffffffffffa8;
  PVar5 = anon_unknown_14::integerBase(value_00);
  lVar1 = strtol(PVar5._first,&local_18,PVar5._second);
  if (local_18 == in_RDI) {
    Warning::Warning(&local_40,(Flags)0x0);
    pDVar3 = Debug::operator<<(&local_40.super_Debug,"Utility::TweakableParser:");
    value_01._sizePlusFlags = in_RSI;
    value_01._data = in_RDI;
    pDVar3 = Debug::operator<<(pDVar3,value_01);
    Debug::operator<<(pDVar3,"is not an integer literal");
  }
  else {
    pcVar2 = Containers::BasicStringView<const_char>::back
                       ((BasicStringView<const_char> *)&stack0xffffffffffffffb0);
    if (*pcVar2 != 'l') {
      pcVar2 = Containers::BasicStringView<const_char>::back
                         ((BasicStringView<const_char> *)&stack0xffffffffffffffb0);
      if (*pcVar2 != 'L') {
        Warning::Warning(&local_40,(Flags)0x0);
        pDVar3 = Debug::operator<<(&local_40.super_Debug,"Utility::TweakableParser:");
        value_02._sizePlusFlags = in_RSI;
        value_02._data = in_RDI;
        pDVar3 = Debug::operator<<(pDVar3,value_02);
        Debug::operator<<(pDVar3,"has an unexpected suffix, expected l");
        goto LAB_0015b5e1;
      }
    }
    if (local_18 == in_RDI + ((in_RSI & 0x3fffffffffffffff) - 1)) {
      uVar4 = CONCAT71((int7)((ulong)(in_RDI + ((in_RSI & 0x3fffffffffffffff) - 1)) >> 8),1);
      goto LAB_0015b5ef;
    }
    Warning::Warning(&local_40,(Flags)0x0);
    pDVar3 = Debug::operator<<(&local_40.super_Debug,
                               "Utility::TweakableParser: unexpected characters");
    value_03 = Containers::BasicStringView<const_char>::suffix
                         ((BasicStringView<const_char> *)&stack0xffffffffffffffb0,local_18);
    pDVar3 = Debug::operator<<(pDVar3,value_03);
    Debug::operator<<(pDVar3,"after an integer literal");
  }
LAB_0015b5e1:
  Warning::~Warning(&local_40);
  uVar4 = CONCAT71((int7)((ulong)extraout_RAX >> 8),2);
  lVar1 = 0;
LAB_0015b5ef:
  PVar6._second = lVar1;
  PVar6._0_8_ = uVar4;
  return PVar6;
}

Assistant:

Containers::Pair<TweakableState, long> TweakableParser<long>::parse(Containers::StringView value) {
    const Containers::Pair<const char*, int> valueBase = integerBase(value);
    char* end;
    const long result = std::strtol(valueBase.first(), &end, valueBase.second());

    if(end == value.begin()) {
        Warning{} << "Utility::TweakableParser:" << value << "is not an integer literal";
        return {TweakableState::Recompile, {}};
    }

    /* If value would be empty, the above catches that */
    if(value.back() != 'l' && value.back() != 'L') {
        Warning{} << "Utility::TweakableParser:" << value << "has an unexpected suffix, expected l";
        return {TweakableState::Recompile, {}};
    }

    if(end != value.end() - 1) {
        Warning{} << "Utility::TweakableParser: unexpected characters" << value.suffix(end) << "after an integer literal";
        return {TweakableState::Recompile, {}};
    }

    return {TweakableState::Success, result};
}